

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlStaticCopyNode(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent,int extended)

{
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlNodePtr pxVar3;
  xmlNsPtr pxVar4;
  xmlAttrPtr pxVar5;
  xmlEntityPtr pxVar6;
  xmlNodePtr copy;
  xmlNodePtr insert;
  xmlNodePtr cur;
  xmlNodePtr root;
  xmlNsPtr ns;
  xmlNodePtr tmp;
  xmlNodePtr ret;
  int extended_local;
  xmlNodePtr parent_local;
  xmlDocPtr doc_local;
  xmlNodePtr node_local;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  switch(node->type) {
  case XML_ELEMENT_NODE:
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_ENTITY_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
  default:
    node_local = (xmlNodePtr)(*xmlMalloc)(0x78);
    if (node_local == (xmlNodePtr)0x0) {
      xmlTreeErrMemory("copying node");
      node_local = (xmlNodePtr)0x0;
    }
    else {
      memset(node_local,0,0x78);
      node_local->type = node->type;
      node_local->doc = doc;
      node_local->parent = parent;
      if (node->name == "text") {
        node_local->name = "text";
      }
      else if (node->name == "textnoenc") {
        node_local->name = "textnoenc";
      }
      else if (node->name == "comment") {
        node_local->name = "comment";
      }
      else if (node->name != (xmlChar *)0x0) {
        if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
          pxVar1 = xmlStrdup(node->name);
          node_local->name = pxVar1;
        }
        else {
          pxVar1 = xmlDictLookup(doc->dict,node->name,-1);
          node_local->name = pxVar1;
        }
      }
      if ((((node->type == XML_ELEMENT_NODE) || (node->content == (xmlChar *)0x0)) ||
          (node->type == XML_ENTITY_REF_NODE)) ||
         ((node->type == XML_XINCLUDE_END || (node->type == XML_XINCLUDE_START)))) {
        if (node->type == XML_ELEMENT_NODE) {
          node_local->line = node->line;
        }
      }
      else {
        pxVar1 = xmlStrdup(node->content);
        node_local->content = pxVar1;
      }
      if (parent != (xmlNodePtr)0x0) {
        if ((__xmlRegisterCallbacks != 0) &&
           (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
          pp_Var2 = __xmlRegisterNodeDefaultValue();
          (**pp_Var2)(node_local);
        }
        pxVar3 = xmlAddChild(parent,node_local);
        if (pxVar3 != node_local) {
          return pxVar3;
        }
      }
      if (extended != 0) {
        if (((node->type == XML_ELEMENT_NODE) || (node->type == XML_XINCLUDE_START)) &&
           (node->nsDef != (xmlNs *)0x0)) {
          pxVar4 = xmlCopyNamespaceList(node->nsDef);
          node_local->nsDef = pxVar4;
        }
        if (node->ns != (xmlNs *)0x0) {
          pxVar4 = xmlSearchNs(doc,node_local,node->ns->prefix);
          if (pxVar4 == (xmlNsPtr)0x0) {
            pxVar4 = xmlSearchNs(node->doc,node,node->ns->prefix);
            cur = node_local;
            if (pxVar4 == (xmlNsPtr)0x0) {
              pxVar4 = xmlNewReconciledNs(doc,node_local,node->ns);
              node_local->ns = pxVar4;
            }
            else {
              for (; cur->parent != (_xmlNode *)0x0; cur = cur->parent) {
              }
              pxVar4 = xmlNewNs(cur,pxVar4->href,pxVar4->prefix);
              node_local->ns = pxVar4;
            }
          }
          else {
            node_local->ns = pxVar4;
          }
        }
        if (((node->type == XML_ELEMENT_NODE) || (node->type == XML_XINCLUDE_START)) &&
           (node->properties != (_xmlAttr *)0x0)) {
          pxVar5 = xmlCopyPropList(node_local,node->properties);
          node_local->properties = pxVar5;
        }
        if (node->type == XML_ENTITY_REF_NODE) {
          if ((doc == (xmlDocPtr)0x0) || (node->doc != doc)) {
            pxVar6 = xmlGetDocEntity(doc,node_local->name);
            node_local->children = (_xmlNode *)pxVar6;
          }
          else {
            node_local->children = node->children;
          }
          node_local->last = node_local->children;
        }
        else if ((node->children != (_xmlNode *)0x0) && (extended != 2)) {
          insert = node->children;
          copy = node_local;
LAB_001bdbc2:
          if (insert != (xmlNodePtr)0x0) {
            pxVar3 = xmlStaticCopyNode(insert,doc,copy,2);
            if (pxVar3 == (xmlNodePtr)0x0) {
              xmlFreeNode(node_local);
              return (xmlNodePtr)0x0;
            }
            if (copy->last != pxVar3) {
              if (copy->last == (_xmlNode *)0x0) {
                copy->children = pxVar3;
              }
              else {
                pxVar3->prev = copy->last;
                copy->last->next = pxVar3;
              }
              copy->last = pxVar3;
            }
            if ((insert->type == XML_ENTITY_REF_NODE) || (insert->children == (_xmlNode *)0x0)) {
              do {
                if (insert->next != (_xmlNode *)0x0) {
                  insert = insert->next;
                  goto LAB_001bdbc2;
                }
                insert = insert->parent;
                copy = copy->parent;
              } while (insert != node);
              insert = (xmlNodePtr)0x0;
            }
            else {
              insert = insert->children;
              copy = pxVar3;
            }
            goto LAB_001bdbc2;
          }
        }
      }
      if (((parent == (xmlNodePtr)0x0) && (__xmlRegisterCallbacks != 0)) &&
         (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var2 = __xmlRegisterNodeDefaultValue();
        (**pp_Var2)(node_local);
      }
    }
    break;
  case XML_ATTRIBUTE_NODE:
    node_local = (xmlNodePtr)xmlCopyPropInternal(doc,parent,(xmlAttrPtr)node);
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    node_local = (xmlNodePtr)xmlCopyDoc((xmlDocPtr)node,extended);
    break;
  case XML_DOCUMENT_TYPE_NODE:
  case XML_NOTATION_NODE:
  case XML_DTD_NODE:
  case XML_ELEMENT_DECL:
  case XML_ATTRIBUTE_DECL:
  case XML_ENTITY_DECL:
    node_local = (xmlNodePtr)0x0;
    break;
  case XML_NAMESPACE_DECL:
    node_local = (xmlNodePtr)xmlCopyNamespaceList((xmlNsPtr)node);
  }
  return node_local;
}

Assistant:

xmlNodePtr
xmlStaticCopyNode(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent,
                  int extended) {
    xmlNodePtr ret;

    if (node == NULL) return(NULL);
    switch (node->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    break;
        case XML_ATTRIBUTE_NODE:
		return((xmlNodePtr) xmlCopyPropInternal(doc, parent, (xmlAttrPtr) node));
        case XML_NAMESPACE_DECL:
	    return((xmlNodePtr) xmlCopyNamespaceList((xmlNsPtr) node));

        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_TREE_ENABLED
	    return((xmlNodePtr) xmlCopyDoc((xmlDocPtr) node, extended));
#endif /* LIBXML_TREE_ENABLED */
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
            return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (ret == NULL) {
	xmlTreeErrMemory("copying node");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNode));
    ret->type = node->type;

    ret->doc = doc;
    ret->parent = parent;
    if (node->name == xmlStringText)
	ret->name = xmlStringText;
    else if (node->name == xmlStringTextNoenc)
	ret->name = xmlStringTextNoenc;
    else if (node->name == xmlStringComment)
	ret->name = xmlStringComment;
    else if (node->name != NULL) {
        if ((doc != NULL) && (doc->dict != NULL))
	    ret->name = xmlDictLookup(doc->dict, node->name, -1);
	else
	    ret->name = xmlStrdup(node->name);
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->content != NULL) &&
	(node->type != XML_ENTITY_REF_NODE) &&
	(node->type != XML_XINCLUDE_END) &&
	(node->type != XML_XINCLUDE_START)) {
	ret->content = xmlStrdup(node->content);
    }else{
      if (node->type == XML_ELEMENT_NODE)
        ret->line = node->line;
    }
    if (parent != NULL) {
	xmlNodePtr tmp;

	/*
	 * this is a tricky part for the node register thing:
	 * in case ret does get coalesced in xmlAddChild
	 * the deregister-node callback is called; so we register ret now already
	 */
	if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	    xmlRegisterNodeDefaultValue((xmlNodePtr)ret);

        /*
         * Note that since ret->parent is already set, xmlAddChild will
         * return early and not actually insert the node. It will only
         * coalesce text nodes and unnecessarily call xmlSetTreeDoc.
         * Assuming that the subtree to be copied always has its text
         * nodes coalesced, the somewhat confusing call to xmlAddChild
         * could be removed.
         */
        tmp = xmlAddChild(parent, ret);
	/* node could have coalesced */
	if (tmp != ret)
	    return(tmp);
    }

    if (!extended)
	goto out;
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->nsDef != NULL))
        ret->nsDef = xmlCopyNamespaceList(node->nsDef);

    if (node->ns != NULL) {
        xmlNsPtr ns;

	ns = xmlSearchNs(doc, ret, node->ns->prefix);
	if (ns == NULL) {
	    /*
	     * Humm, we are copying an element whose namespace is defined
	     * out of the new tree scope. Search it in the original tree
	     * and add it at the top of the new tree
	     */
	    ns = xmlSearchNs(node->doc, node, node->ns->prefix);
	    if (ns != NULL) {
	        xmlNodePtr root = ret;

		while (root->parent != NULL) root = root->parent;
		ret->ns = xmlNewNs(root, ns->href, ns->prefix);
		} else {
			ret->ns = xmlNewReconciledNs(doc, ret, node->ns);
	    }
	} else {
	    /*
	     * reference the existing namespace definition in our own tree.
	     */
	    ret->ns = ns;
	}
    }
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->properties != NULL))
        ret->properties = xmlCopyPropList(ret, node->properties);
    if (node->type == XML_ENTITY_REF_NODE) {
	if ((doc == NULL) || (node->doc != doc)) {
	    /*
	     * The copied node will go into a separate document, so
	     * to avoid dangling references to the ENTITY_DECL node
	     * we cannot keep the reference. Try to find it in the
	     * target document.
	     */
	    ret->children = (xmlNodePtr) xmlGetDocEntity(doc, ret->name);
	} else {
            ret->children = node->children;
	}
	ret->last = ret->children;
    } else if ((node->children != NULL) && (extended != 2)) {
        xmlNodePtr cur, insert;

        cur = node->children;
        insert = ret;
        while (cur != NULL) {
            xmlNodePtr copy = xmlStaticCopyNode(cur, doc, insert, 2);
            if (copy == NULL) {
                xmlFreeNode(ret);
                return(NULL);
            }

            /* Check for coalesced text nodes */
            if (insert->last != copy) {
                if (insert->last == NULL) {
                    insert->children = copy;
                } else {
                    copy->prev = insert->last;
                    insert->last->next = copy;
                }
                insert->last = copy;
            }

            if ((cur->type != XML_ENTITY_REF_NODE) &&
                (cur->children != NULL)) {
                cur = cur->children;
                insert = copy;
                continue;
            }

            while (1) {
                if (cur->next != NULL) {
                    cur = cur->next;
                    break;
                }

                cur = cur->parent;
                insert = insert->parent;
                if (cur == node) {
                    cur = NULL;
                    break;
                }
            }
        }
    }

out:
    /* if parent != NULL we already registered the node above */
    if ((parent == NULL) &&
        ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue)))
	xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    return(ret);
}